

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoquad.h
# Opt level: O0

void pzgeom::TPZGeoQuad::GradX<Fad<double>>
               (TPZFMatrix<double> *nodes,TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *gradx)

{
  int64_t iVar1;
  long *in_RDX;
  TPZBaseMatrix *in_RDI;
  TPZFMatrix<Fad<double>_> *this;
  int j;
  int i;
  TPZFNMatrix<6,_Fad<double>_> dphi;
  TPZFNMatrix<3,_Fad<double>_> phi;
  int ncol;
  int space;
  Fad<double> *in_stack_fffffffffffffcd0;
  Fad<double> *in_stack_fffffffffffffce0;
  Fad<double> *in_stack_fffffffffffffce8;
  TPZFMatrix<Fad<double>_> *this_00;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *x;
  Fad<double> *this_01;
  Fad<double> *in_stack_fffffffffffffd10;
  double in_stack_fffffffffffffd18;
  int64_t in_stack_fffffffffffffd20;
  int64_t in_stack_fffffffffffffd28;
  TPZFNMatrix<6,_Fad<double>_> *in_stack_fffffffffffffd30;
  int local_2b4;
  int local_2b0;
  
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  TPZBaseMatrix::Cols(in_RDI);
  x = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)0x2;
  (**(code **)(*in_RDX + 0x68))(in_RDX,(long)(int)iVar1);
  (**(code **)(*in_RDX + 0x78))();
  this_01 = (Fad<double> *)0x4;
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<3,_Fad<double>_> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             in_stack_fffffffffffffd20);
  TPZFNMatrix<6,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  pztopology::TPZQuadrilateral::TShape<Fad<double>>
            ((TPZVec<Fad<double>_> *)dphi.fBuf[0].defaultVal,
             (TPZFMatrix<Fad<double>_> *)dphi.fBuf[0].dx_.ptr_to_data,
             (TPZFMatrix<Fad<double>_> *)dphi.fBuf[0].dx_._0_8_);
  for (local_2b0 = 0; local_2b0 < 4; local_2b0 = local_2b0 + 1) {
    for (local_2b4 = 0; local_2b4 < (int)iVar1; local_2b4 = local_2b4 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_2b4,(long)local_2b0);
      this_00 = this;
      in_stack_fffffffffffffce8 =
           TPZFMatrix<Fad<double>_>::operator()
                     (this,(int64_t)in_stack_fffffffffffffce8,(int64_t)in_stack_fffffffffffffce0);
      operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      in_stack_fffffffffffffce0 =
           TPZFMatrix<Fad<double>_>::operator()
                     (this_00,(int64_t)in_stack_fffffffffffffce8,(int64_t)in_stack_fffffffffffffce0)
      ;
      Fad<double>::operator+=(this_01,x);
      FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffcd0);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_2b4,(long)local_2b0);
      in_stack_fffffffffffffcd0 =
           TPZFMatrix<Fad<double>_>::operator()
                     (this_00,(int64_t)in_stack_fffffffffffffce8,(int64_t)in_stack_fffffffffffffce0)
      ;
      operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      TPZFMatrix<Fad<double>_>::operator()
                (this_00,(int64_t)in_stack_fffffffffffffce8,(int64_t)in_stack_fffffffffffffce0);
      Fad<double>::operator+=(this_01,x);
      FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffcd0);
    }
  }
  TPZFNMatrix<6,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<6,_Fad<double>_> *)0x16225fd);
  TPZFNMatrix<3,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<3,_Fad<double>_> *)0x162260a);
  return;
}

Assistant:

inline void TPZGeoQuad::GradX(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc, TPZFMatrix<T> &gradx){
        
        int space = nodes.Rows();
        int ncol = nodes.Cols();
        
        gradx.Resize(space,2);
        gradx.Zero();
        
#ifdef PZDEBUG
        if(/* nrow != 3 || */ ncol  != 4){
            std::cout << "Objects of incompatible lengths, gradient cannot be computed." << std::endl;
            std::cout << "nodes matrix must be spacex4." << std::endl;
            DebugStop();
        }
        
#endif
        TPZFNMatrix<3,T> phi(4,1);
        TPZFNMatrix<6,T> dphi(2,4);
        TShape(loc,phi,dphi);
        for(int i = 0; i < 4; i++)
        {
            for(int j = 0; j < space; j++)
            {
                gradx(j,0) += nodes.GetVal(j,i)*dphi(0,i);
                gradx(j,1) += nodes.GetVal(j,i)*dphi(1,i);
            }
        }
        
    }